

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

e_int16 OPLL_calc(OPLL *opll)

{
  e_int16 eVar1;
  OPLL *opll_local;
  
  if (opll->quality == 0) {
    opll_local._6_2_ = calc(opll);
  }
  else {
    while (opll->oplltime < opll->realstep) {
      opll->oplltime = opll->opllstep + opll->oplltime;
      opll->prev = opll->next;
      eVar1 = calc(opll);
      opll->next = (int)eVar1;
    }
    opll->oplltime = opll->oplltime - opll->realstep;
    opll->out = (int)(short)(int)(((double)opll->next * (double)(opll->opllstep - opll->oplltime) +
                                  (double)opll->prev * (double)opll->oplltime) /
                                 (double)opll->opllstep);
    opll_local._6_2_ = (e_int16)opll->out;
  }
  return opll_local._6_2_;
}

Assistant:

e_int16
OPLL_calc (OPLL * opll)
{
  if (!opll->quality)
    return calc (opll);

  while (opll->realstep > opll->oplltime)
  {
    opll->oplltime += opll->opllstep;
    opll->prev = opll->next;
    opll->next = calc (opll);
  }

  opll->oplltime -= opll->realstep;
  opll->out = (e_int16) (((double) opll->next * (opll->opllstep - opll->oplltime)
                          + (double) opll->prev * opll->oplltime) / opll->opllstep);

  return (e_int16) opll->out;
}